

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix.h
# Opt level: O2

void __thiscall
mp::BasicSuffixSet<std::allocator<char>_>::~BasicSuffixSet
          (BasicSuffixSet<std::allocator<char>_> *this)

{
  ~BasicSuffixSet(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

BasicSuffixSet<Alloc>::~BasicSuffixSet() {
  /// Deallocate names and values.
  for (typename Set::iterator i = set_.begin(), e = set_.end(); i != e; ++i) {
    Deallocate(const_cast<char*>(i->name.data()), i->name.size()+1);
    if ((i->kind & suf::FLOAT) != 0)
      Deallocate(i->dbl_values, i->num_values);
    else
      Deallocate(i->int_values, i->num_values);
  }
}